

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_thread.c
# Opt level: O0

void * nhr_thread_func_priv(void *some_pointer)

{
  nhr_thread t;
  void *some_pointer_local;
  
  (**some_pointer)(*(undefined8 *)((long)some_pointer + 8));
  nhr_threads_joiner_add((nhr_thread)some_pointer);
  return (void *)0x0;
}

Assistant:

static void * nhr_thread_func_priv(void * some_pointer) {
#endif
	nhr_thread t = (nhr_thread)some_pointer;
	t->thread_function(t->user_object);
	nhr_threads_joiner_add(t);

#if  defined(NHR_OS_WINDOWS)
	return 0;
#else
	return NULL;
#endif
}